

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O2

void __thiscall llbuild::buildsystem::BuildFile::~BuildFile(BuildFile *this)

{
  void *pvVar1;
  
  pvVar1 = this->impl;
  if (pvVar1 != (void *)0x0) {
    llvm::
    StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
    ::~StringMap((StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                  *)((long)pvVar1 + 0xa8));
    llvm::
    StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
    ::~StringMap((StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
                  *)((long)pvVar1 + 0x88));
    std::__cxx11::string::_M_dispose();
    llvm::
    StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
    ::~StringMap((StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
                  *)((long)pvVar1 + 0x48));
    llvm::
    StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
    ::~StringMap((StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
                  *)((long)pvVar1 + 0x28));
    std::__cxx11::string::_M_dispose();
  }
  operator_delete(pvVar1,0xd0);
  return;
}

Assistant:

BuildFile::~BuildFile() {
  delete static_cast<BuildFileImpl*>(impl);
}